

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::InvalidateBufferStorageTestCase::initTestCaseGlobal(InvalidateBufferStorageTestCase *this)

{
  uint uVar1;
  uint local_18;
  uint local_14;
  InvalidateBufferStorageTestCase *pIStack_10;
  uint n_bytes_needed;
  InvalidateBufferStorageTestCase *this_local;
  
  local_14 = this->m_n_pages_to_use * this->m_page_size;
  this->m_sparse_bo_size = local_14;
  local_18 = this->m_page_size;
  pIStack_10 = this;
  uVar1 = SparseBufferTestUtilities::alignOffset(&local_14,&local_18);
  this->m_sparse_bo_size_rounded = uVar1;
  return true;
}

Assistant:

bool InvalidateBufferStorageTestCase::initTestCaseGlobal()
{
	const unsigned int n_bytes_needed = m_n_pages_to_use * m_page_size;

	/* Determine the number of bytes both the helper and the sparse buffer
	 * object need to be able to hold, at maximum */
	m_sparse_bo_size		 = n_bytes_needed;
	m_sparse_bo_size_rounded = SparseBufferTestUtilities::alignOffset(n_bytes_needed, m_page_size);

	return true;
}